

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O2

void __thiscall despot::NoisyLaserTag::NoisyLaserTag(NoisyLaserTag *this,string *params_file)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)params_file);
  BaseTag::BaseTag(&this->super_BaseTag,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)&this->super_BaseTag = &PTR__NoisyLaserTag_00121a08;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__NoisyLaserTag_00121b38;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__NoisyLaserTag_00121c40;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__NoisyLaserTag_00121c78;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__NoisyLaserTag_00121ca0;
  this->noise_sigma_ = 2.5;
  this->unit_size_ = 1.0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Init(this);
  (this->super_BaseTag).robot_pos_unknown_ = true;
  return;
}

Assistant:

NoisyLaserTag::NoisyLaserTag(string params_file) :
	BaseTag(params_file),
	noise_sigma_(2.5),
	unit_size_(1.0) {
	Init();
  robot_pos_unknown_ = true;
}